

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::print(JSPrinter *this,Ref node)

{
  FILE *__stream;
  bool bVar1;
  Value *pVVar2;
  Ref *this_00;
  IString *pIVar3;
  const_reference pvVar4;
  const_pointer pvVar5;
  undefined1 auStack_48 [8];
  IString type;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  ensure(this,100);
  pVVar2 = Ref::operator->((Ref *)&this_local);
  bVar1 = Value::isString(pVVar2);
  if (bVar1) {
    printName(this,(Ref)this_local);
  }
  else {
    pVVar2 = Ref::operator->((Ref *)&this_local);
    bVar1 = Value::isNumber(pVVar2);
    if (bVar1) {
      printNum(this,(Ref)this_local);
    }
    else {
      pVVar2 = Ref::operator->((Ref *)&this_local);
      bVar1 = Value::isAssignName(pVVar2);
      if (bVar1) {
        printAssignName(this,(Ref)this_local);
      }
      else {
        pVVar2 = Ref::operator->((Ref *)&this_local);
        bVar1 = Value::isAssign(pVVar2);
        if (bVar1) {
          type.str._M_str = &this_local->pretty;
          printAssign(this,(Ref)this_local);
        }
        else {
          this_00 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
          pVVar2 = Ref::operator->(this_00);
          pIVar3 = Value::getIString(pVVar2);
          auStack_48 = (undefined1  [8])(pIVar3->str)._M_len;
          type.str._M_len = (size_t)(pIVar3->str)._M_str;
          pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)auStack_48,0);
          __stream = _stderr;
          switch(*pvVar4) {
          case 'a':
            bVar1 = ::wasm::IString::operator==((IString *)auStack_48,(IString *)&ARRAY);
            if (!bVar1) {
              abort();
            }
            printArray(this,(Ref)this_local);
            break;
          case 'b':
            bVar1 = ::wasm::IString::operator==((IString *)auStack_48,(IString *)&BINARY);
            if (bVar1) {
              printBinary(this,(Ref)this_local);
            }
            else {
              bVar1 = ::wasm::IString::operator==((IString *)auStack_48,(IString *)&BLOCK);
              if (bVar1) {
                printBlock(this,(Ref)this_local);
              }
              else {
                bVar1 = ::wasm::IString::operator==((IString *)auStack_48,(IString *)&BREAK);
                if (!bVar1) {
                  abort();
                }
                printBreak(this,(Ref)this_local);
              }
            }
            break;
          case 'c':
            bVar1 = ::wasm::IString::operator==((IString *)auStack_48,(IString *)&CALL);
            if (bVar1) {
              printCall(this,(Ref)this_local);
            }
            else {
              bVar1 = ::wasm::IString::operator==((IString *)auStack_48,(IString *)&CONDITIONAL);
              if (bVar1) {
                printConditional(this,(Ref)this_local);
              }
              else {
                bVar1 = ::wasm::IString::operator==((IString *)auStack_48,(IString *)&CONTINUE);
                if (!bVar1) {
                  abort();
                }
                printContinue(this,(Ref)this_local);
              }
            }
            break;
          case 'd':
            bVar1 = ::wasm::IString::operator==((IString *)auStack_48,(IString *)&DEFUN);
            if (bVar1) {
              printDefun(this,(Ref)this_local);
            }
            else {
              bVar1 = ::wasm::IString::operator==((IString *)auStack_48,(IString *)&DO);
              if (bVar1) {
                printDo(this,(Ref)this_local);
              }
              else {
                bVar1 = ::wasm::IString::operator==((IString *)auStack_48,(IString *)&DOT);
                if (!bVar1) {
                  abort();
                }
                printDot(this,(Ref)this_local);
              }
            }
            break;
          default:
            pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data
                               ((basic_string_view<char,_std::char_traits<char>_> *)auStack_48);
            fprintf(__stream,"cannot yet print %s\n\n",pvVar5);
            abort();
          case 'i':
            bVar1 = ::wasm::IString::operator==((IString *)auStack_48,(IString *)&IF);
            if (!bVar1) {
              abort();
            }
            printIf(this,(Ref)this_local);
            break;
          case 'l':
            bVar1 = ::wasm::IString::operator==((IString *)auStack_48,(IString *)&LABEL);
            if (!bVar1) {
              abort();
            }
            printLabel(this,(Ref)this_local);
            break;
          case 'n':
            bVar1 = ::wasm::IString::operator==((IString *)auStack_48,(IString *)&NEW);
            if (!bVar1) {
              abort();
            }
            printNew(this,(Ref)this_local);
            break;
          case 'o':
            bVar1 = ::wasm::IString::operator==((IString *)auStack_48,(IString *)&OBJECT);
            if (bVar1) {
              printObject(this,(Ref)this_local);
            }
            break;
          case 'r':
            bVar1 = ::wasm::IString::operator==((IString *)auStack_48,(IString *)&RETURN);
            if (!bVar1) {
              abort();
            }
            printReturn(this,(Ref)this_local);
            break;
          case 's':
            bVar1 = ::wasm::IString::operator==((IString *)auStack_48,(IString *)&SUB);
            if (bVar1) {
              printSub(this,(Ref)this_local);
            }
            else {
              bVar1 = ::wasm::IString::operator==((IString *)auStack_48,(IString *)&SEQ);
              if (bVar1) {
                printSeq(this,(Ref)this_local);
              }
              else {
                bVar1 = ::wasm::IString::operator==((IString *)auStack_48,(IString *)&SWITCH);
                if (bVar1) {
                  printSwitch(this,(Ref)this_local);
                }
                else {
                  bVar1 = ::wasm::IString::operator==((IString *)auStack_48,(IString *)&STRING);
                  if (!bVar1) {
                    abort();
                  }
                  printString(this,(Ref)this_local);
                }
              }
            }
            break;
          case 't':
            bVar1 = ::wasm::IString::operator==((IString *)auStack_48,(IString *)&TOPLEVEL);
            if (bVar1) {
              printToplevel(this,(Ref)this_local);
            }
            else {
              bVar1 = ::wasm::IString::operator==((IString *)auStack_48,(IString *)&TRY);
              if (!bVar1) {
                abort();
              }
              printTry(this,(Ref)this_local);
            }
            break;
          case 'u':
            bVar1 = ::wasm::IString::operator==((IString *)auStack_48,(IString *)&UNARY_PREFIX);
            if (!bVar1) {
              abort();
            }
            printUnaryPrefix(this,(Ref)this_local);
            break;
          case 'v':
            bVar1 = ::wasm::IString::operator==((IString *)auStack_48,(IString *)&VAR);
            if (!bVar1) {
              abort();
            }
            printVar(this,(Ref)this_local);
            break;
          case 'w':
            bVar1 = ::wasm::IString::operator==((IString *)auStack_48,(IString *)&WHILE);
            if (!bVar1) {
              abort();
            }
            printWhile(this,(Ref)this_local);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void print(Ref node) {
    ensure();
    if (node->isString()) {
      printName(node);
      return;
    }
    if (node->isNumber()) {
      printNum(node);
      return;
    }
    if (node->isAssignName()) {
      printAssignName(node);
      return;
    }
    if (node->isAssign()) {
      printAssign(node);
      return;
    }
    IString type = node[0]->getIString();
    switch (type.str[0]) {
      case 'a': {
        if (type == ARRAY) {
          printArray(node);
        } else {
          abort();
        }
        break;
      }
      case 'b': {
        if (type == BINARY) {
          printBinary(node);
        } else if (type == BLOCK) {
          printBlock(node);
        } else if (type == BREAK) {
          printBreak(node);
        } else {
          abort();
        }
        break;
      }
      case 'c': {
        if (type == CALL) {
          printCall(node);
        } else if (type == CONDITIONAL) {
          printConditional(node);
        } else if (type == CONTINUE) {
          printContinue(node);
        } else {
          abort();
        }
        break;
      }
      case 'd': {
        if (type == DEFUN) {
          printDefun(node);
        } else if (type == DO) {
          printDo(node);
        } else if (type == DOT) {
          printDot(node);
        } else {
          abort();
        }
        break;
      }
      case 'i': {
        if (type == IF) {
          printIf(node);
        } else {
          abort();
        }
        break;
      }
      case 'l': {
        if (type == LABEL) {
          printLabel(node);
        } else {
          abort();
        }
        break;
      }
      case 'n': {
        if (type == NEW) {
          printNew(node);
        } else {
          abort();
        }
        break;
      }
      case 'o': {
        if (type == OBJECT) {
          printObject(node);
        }
        break;
      }
      case 'r': {
        if (type == RETURN) {
          printReturn(node);
        } else {
          abort();
        }
        break;
      }
      case 's': {
        if (type == SUB) {
          printSub(node);
        } else if (type == SEQ) {
          printSeq(node);
        } else if (type == SWITCH) {
          printSwitch(node);
        } else if (type == STRING) {
          printString(node);
        } else {
          abort();
        }
        break;
      }
      case 't': {
        if (type == TOPLEVEL) {
          printToplevel(node);
        } else if (type == TRY) {
          printTry(node);
        } else {
          abort();
        }
        break;
      }
      case 'u': {
        if (type == UNARY_PREFIX) {
          printUnaryPrefix(node);
        } else {
          abort();
        }
        break;
      }
      case 'v': {
        if (type == VAR) {
          printVar(node);
        } else {
          abort();
        }
        break;
      }
      case 'w': {
        if (type == WHILE) {
          printWhile(node);
        } else {
          abort();
        }
        break;
      }
      default: {
        errv("cannot yet print %s\n", type.str.data());
        abort();
      }
    }
  }